

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int aead_decrypt(st_ptls_traffic_protection_t *ctx,void *output,size_t *outlen,void *input,
                size_t inlen)

{
  st_ptls_aead_algorithm_t *psVar1;
  void *in_RCX;
  ptls_aead_context_t *in_RDX;
  size_t in_RDI;
  void *in_R8;
  uint8_t aad [5];
  uint64_t in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  int local_4;
  
  build_aad(&stack0xffffffffffffffcb,(size_t)in_R8);
  psVar1 = (st_ptls_aead_algorithm_t *)
           ptls_aead_decrypt(in_RDX,in_RCX,in_R8,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0
                             ,(void *)0x5,in_RDI);
  in_RDX->algo = psVar1;
  if (psVar1 == (st_ptls_aead_algorithm_t *)0xffffffffffffffff) {
    local_4 = 0x14;
  }
  else {
    *(long *)(in_RDI + 0x50) = *(long *)(in_RDI + 0x50) + 1;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int aead_decrypt(struct st_ptls_traffic_protection_t *ctx, void *output, size_t *outlen, const void *input, size_t inlen)
{
    uint8_t aad[5];

    build_aad(aad, inlen);
    if ((*outlen = ptls_aead_decrypt(ctx->aead, output, input, inlen, ctx->seq, aad, sizeof(aad))) == SIZE_MAX)
        return PTLS_ALERT_BAD_RECORD_MAC;
    ++ctx->seq;
    return 0;
}